

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_iterator.h
# Opt level: O0

void __thiscall
spvtools::opt::TreeDFIterator<const_spvtools::opt::DominatorTreeNode>::MoveToNextNode
          (TreeDFIterator<const_spvtools::opt::DominatorTreeNode> *this)

{
  bool bVar1;
  reference ppDVar2;
  __normal_iterator<spvtools::opt::DominatorTreeNode_*const_*,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>
  local_48;
  pair<const_spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_*const_*,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>
  local_40;
  __normal_iterator<spvtools::opt::DominatorTreeNode_*const_*,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>
  local_30;
  __normal_iterator<spvtools::opt::DominatorTreeNode_*const_*,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>
  local_28;
  __normal_iterator<spvtools::opt::DominatorTreeNode_*const_*,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>
  local_20;
  reference local_18;
  pair<const_spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_*const_*,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>
  *next_it;
  TreeDFIterator<const_spvtools::opt::DominatorTreeNode> *this_local;
  
  if (this->current_ != (NodePtr)0x0) {
    next_it = (pair<const_spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_*const_*,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>
               *)this;
    bVar1 = std::
            stack<std::pair<const_spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_*const_*,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>,_std::deque<std::pair<const_spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_*const_*,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>,_std::allocator<std::pair<const_spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_*const_*,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>_>_>_>
            ::empty(&this->parent_iterators_);
    if (bVar1) {
      this->current_ = (NodePtr)0x0;
    }
    else {
      local_18 = std::
                 stack<std::pair<const_spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_*const_*,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>,_std::deque<std::pair<const_spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_*const_*,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>,_std::allocator<std::pair<const_spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_*const_*,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>_>_>_>
                 ::top(&this->parent_iterators_);
      ppDVar2 = __gnu_cxx::
                __normal_iterator<spvtools::opt::DominatorTreeNode_*const_*,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>
                ::operator*(&local_18->second);
      this->current_ = *ppDVar2;
      __gnu_cxx::
      __normal_iterator<spvtools::opt::DominatorTreeNode_*const_*,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>
      ::operator++(&local_18->second);
      local_20._M_current = (DominatorTreeNode **)DominatorTreeNode::end(local_18->first);
      bVar1 = __gnu_cxx::operator==(&local_20,&local_18->second);
      if (bVar1) {
        std::
        stack<std::pair<const_spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_*const_*,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>,_std::deque<std::pair<const_spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_*const_*,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>,_std::allocator<std::pair<const_spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_*const_*,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>_>_>_>
        ::pop(&this->parent_iterators_);
      }
      local_28._M_current = (DominatorTreeNode **)DominatorTreeNode::begin(this->current_);
      local_30._M_current = (DominatorTreeNode **)DominatorTreeNode::end(this->current_);
      bVar1 = __gnu_cxx::operator!=(&local_28,&local_30);
      if (bVar1) {
        local_48._M_current = (DominatorTreeNode **)DominatorTreeNode::begin(this->current_);
        local_40 = std::
                   make_pair<spvtools::opt::DominatorTreeNode_const*&,__gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode*const*,std::vector<spvtools::opt::DominatorTreeNode*,std::allocator<spvtools::opt::DominatorTreeNode*>>>>
                             (&this->current_,&local_48);
        std::
        stack<std::pair<spvtools::opt::DominatorTreeNode_const*,__gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode*const*,std::vector<spvtools::opt::DominatorTreeNode*,std::allocator<spvtools::opt::DominatorTreeNode*>>>>,std::deque<std::pair<spvtools::opt::DominatorTreeNode_const*,__gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode*const*,std::vector<spvtools::opt::DominatorTreeNode*,std::allocator<spvtools::opt::DominatorTreeNode*>>>>,std::allocator<std::pair<spvtools::opt::DominatorTreeNode_const*,__gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode*const*,std::vector<spvtools::opt::DominatorTreeNode*,std::allocator<spvtools::opt::DominatorTreeNode*>>>>>>>
        ::
        emplace<std::pair<spvtools::opt::DominatorTreeNode_const*,__gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode*const*,std::vector<spvtools::opt::DominatorTreeNode*,std::allocator<spvtools::opt::DominatorTreeNode*>>>>>
                  ((stack<std::pair<spvtools::opt::DominatorTreeNode_const*,__gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode*const*,std::vector<spvtools::opt::DominatorTreeNode*,std::allocator<spvtools::opt::DominatorTreeNode*>>>>,std::deque<std::pair<spvtools::opt::DominatorTreeNode_const*,__gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode*const*,std::vector<spvtools::opt::DominatorTreeNode*,std::allocator<spvtools::opt::DominatorTreeNode*>>>>,std::allocator<std::pair<spvtools::opt::DominatorTreeNode_const*,__gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode*const*,std::vector<spvtools::opt::DominatorTreeNode*,std::allocator<spvtools::opt::DominatorTreeNode*>>>>>>>
                    *)&this->parent_iterators_,&local_40);
      }
    }
  }
  return;
}

Assistant:

inline void MoveToNextNode() {
    if (!current_) return;
    if (parent_iterators_.empty()) {
      current_ = nullptr;
      return;
    }
    std::pair<NodePtr, NodeIterator>& next_it = parent_iterators_.top();
    // Set the new node.
    current_ = *next_it.second;
    // Update the iterator for the next child.
    ++next_it.second;
    // If we finished with node, pop it.
    if (next_it.first->end() == next_it.second) parent_iterators_.pop();
    // If our current node is not a leaf, store the iteration state for later.
    if (current_->begin() != current_->end())
      parent_iterators_.emplace(make_pair(current_, current_->begin()));
  }